

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int MD5_Update(MD5_CTX *c,void *data,size_t len)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  uchar *p;
  size_t sStack_20;
  uint32_t t;
  size_t len_local;
  uchar *buf_local;
  MD5_CTX *ctx_local;
  
  uVar2 = c->Nl;
  uVar1 = uVar2 + (int)len * 8;
  c->Nl = uVar1;
  if (uVar1 < uVar2) {
    c->Nh = c->Nh + 1;
  }
  c->Nh = ((uint)(len >> 0x1d) & 7) + c->Nh;
  uVar2 = uVar2 >> 3 & 0x3f;
  sStack_20 = len;
  len_local = (size_t)data;
  if (uVar2 != 0) {
    pvVar3 = (void *)((long)c->data + (ulong)uVar2);
    uVar2 = 0x40 - uVar2;
    if (len < uVar2) {
      pvVar3 = memcpy(pvVar3,data,len);
      return (int)pvVar3;
    }
    memcpy(pvVar3,data,(ulong)uVar2);
    byteReverse((uchar *)c->data,0x10);
    MD5Transform(&c->A,c->data);
    len_local = (long)data + (ulong)uVar2;
    sStack_20 = len - uVar2;
  }
  for (; 0x3f < sStack_20; sStack_20 = sStack_20 - 0x40) {
    memcpy(c->data,(void *)len_local,0x40);
    byteReverse((uchar *)c->data,0x10);
    MD5Transform(&c->A,c->data);
    len_local = len_local + 0x40;
  }
  pvVar3 = memcpy(c->data,(void *)len_local,sStack_20);
  return (int)pvVar3;
}

Assistant:

void MD5_Update(MD5_CTX *ctx, const unsigned char *buf, size_t len) {
    uint32_t t;

    t = ctx->bits[0];
    if ((ctx->bits[0] = t + ((uint32_t) len << 3)) < t) ctx->bits[1]++;
    ctx->bits[1] += (uint32_t) len >> 29;

    t = (t >> 3) & 0x3f;

    if (t) {
        unsigned char *p = (unsigned char *) ctx->in + t;

        t = 64 - t;
        if (len < t) {
            memcpy(p, buf, len);
            return;
        }
        memcpy(p, buf, t);
        byteReverse(ctx->in, 16);
        MD5Transform(ctx->buf, (uint32_t *) ctx->in);
        buf += t;
        len -= t;
    }

    while (len >= 64) {
        memcpy(ctx->in, buf, 64);
        byteReverse(ctx->in, 16);
        MD5Transform(ctx->buf, (uint32_t *) ctx->in);
        buf += 64;
        len -= 64;
    }

    memcpy(ctx->in, buf, len);
}